

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyDrawAttribs(DrawAttribs *Attribs)

{
  string _msg;
  string local_28;
  
  if (Attribs->NumVertices == 0) {
    FormatString<char[104]>
              (&local_28,
               (char (*) [104])
               "DrawAttribs.NumVertices is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_28._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&local_28);
  }
  if (Attribs->NumInstances == 0) {
    FormatString<char[105]>(&local_28,(char (*) [105])0x65db50);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_28._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&local_28);
  }
  return true;
}

Assistant:

bool VerifyDrawAttribs(const DrawAttribs& Attribs)
{
    if (Attribs.NumVertices == 0)
        LOG_INFO_MESSAGE("DrawAttribs.NumVertices is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.NumInstances == 0)
        LOG_INFO_MESSAGE("DrawAttribs.NumInstances is 0. This is OK as the draw command will be ignored, but may be unintentional.");

    return true;
}